

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IntFloatCompare(i64 i,double r)

{
  longdouble x;
  double r_local;
  i64 i_local;
  
  if (r <= (double)i) {
    if ((double)i <= r) {
      i_local._4_4_ = 0;
    }
    else {
      i_local._4_4_ = 1;
    }
  }
  else {
    i_local._4_4_ = -1;
  }
  return i_local._4_4_;
}

Assistant:

static int sqlite3IntFloatCompare(i64 i, double r){
  if( sizeof(LONGDOUBLE_TYPE)>8 ){
    LONGDOUBLE_TYPE x = (LONGDOUBLE_TYPE)i;
    if( x<r ) return -1;
    if( x>r ) return +1;
    return 0;
  }else{
    i64 y;
    double s;
    if( r<-9223372036854775808.0 ) return +1;
    if( r>=9223372036854775808.0 ) return -1;
    y = (i64)r;
    if( i<y ) return -1;
    if( i>y ) return +1;
    s = (double)i;
    if( s<r ) return -1;
    if( s>r ) return +1;
    return 0;
  }
}